

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableStruct.cpp
# Opt level: O2

void __thiscall
adios2::core::StructDefinition::AddField
          (StructDefinition *this,string *name,size_t offset,DataType type,size_t elementcount)

{
  pointer pSVar1;
  size_t sVar2;
  allocator local_ac;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (this->m_Frozen == true) {
    std::__cxx11::string::string((string *)&local_48,"core",&local_a9);
    std::__cxx11::string::string((string *)&local_68,"VariableStruct::StructDefinition",&local_aa);
    std::__cxx11::string::string((string *)&local_88,"AddField",&local_ab);
    std::__cxx11::string::string((string *)&local_a8,"struct definition already frozen",&local_ac);
    helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((type & ~Struct) == None) {
    std::__cxx11::string::string((string *)&local_48,"core",&local_a9);
    std::__cxx11::string::string((string *)&local_68,"VariableStruct::StructDefinition",&local_aa);
    std::__cxx11::string::string((string *)&local_88,"AddField",&local_ab);
    std::__cxx11::string::string((string *)&local_a8,"invalid data type",&local_ac);
    helper::Throw<std::invalid_argument>(&local_48,&local_68,&local_88,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  sVar2 = helper::GetDataTypeSize(type);
  if (this->m_StructSize < sVar2 * elementcount + offset) {
    std::__cxx11::string::string((string *)&local_48,"core",&local_a9);
    std::__cxx11::string::string((string *)&local_68,"VariableStruct::StructDefinition",&local_aa);
    std::__cxx11::string::string((string *)&local_88,"AddField",&local_ab);
    std::__cxx11::string::string((string *)&local_a8,"exceeded struct size",&local_ac);
    helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::
  vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
  ::emplace_back<>(&this->m_Definition);
  pSVar1 = (this->m_Definition).
           super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)(pSVar1 + -1));
  pSVar1[-1].Offset = offset;
  pSVar1[-1].Type = type;
  pSVar1[-1].ElementCount = elementcount;
  return;
}

Assistant:

void StructDefinition::AddField(const std::string &name, const size_t offset, const DataType type,
                                const size_t elementcount)
{
    if (m_Frozen)
    {
        helper::Throw<std::runtime_error>("core", "VariableStruct::StructDefinition", "AddField",
                                          "struct definition already frozen");
    }
    if (type == DataType::None || type == DataType::Struct)
    {
        helper::Throw<std::invalid_argument>("core", "VariableStruct::StructDefinition", "AddField",
                                             "invalid data type");
    }
    if (offset + helper::GetDataTypeSize(type) * elementcount > m_StructSize)
    {
        helper::Throw<std::runtime_error>("core", "VariableStruct::StructDefinition", "AddField",
                                          "exceeded struct size");
    }
    m_Definition.emplace_back();
    auto &d = m_Definition.back();
    d.Name = name;
    d.Offset = offset;
    d.Type = type;
    d.ElementCount = elementcount;
}